

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnFunctionName
          (BinaryReaderIR *this,Index index,string_view name)

{
  Result RVar1;
  Index index_local;
  BinaryReaderIR *this_local;
  string_view name_local;
  
  RVar1 = SetFunctionName(this,index,name);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnFunctionName(Index index, std::string_view name) {
  return SetFunctionName(index, name);
}